

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::truncate
          (ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *this,char *__file,
          __off_t __length)

{
  Array<capnp::Orphan<capnp::compiler::Token>_> *pAVar1;
  Array<capnp::Orphan<capnp::compiler::Token>_> *pAVar2;
  Orphan<capnp::compiler::Token> *pOVar3;
  size_t sVar4;
  
  pAVar1 = this->ptr;
  pAVar2 = this->pos;
  while (pAVar1 + (long)__file < pAVar2) {
    this->pos = pAVar2 + -1;
    pOVar3 = pAVar2[-1].ptr;
    if (pOVar3 != (Orphan<capnp::compiler::Token> *)0x0) {
      sVar4 = pAVar2[-1].size_;
      pAVar2[-1].ptr = (Orphan<capnp::compiler::Token> *)0x0;
      pAVar2[-1].size_ = 0;
      (**(pAVar2[-1].disposer)->_vptr_ArrayDisposer)
                (pAVar2[-1].disposer,pOVar3,0x20,sVar4,sVar4,
                 ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Token>_>::destruct);
    }
    pAVar2 = this->pos;
  }
  return (int)pAVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }